

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O2

void write_marking(MppWriteCtx *s,H264eMarkingInfo *marking)

{
  int iVar1;
  uint val;
  uint val_00;
  uint val_01;
  uint val_02;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (marking->idr_flag != 0) {
    mpp_writer_put_bits(s,marking->no_output_of_prior_pics,1);
    if (((byte)h264e_debug & 0x40) != 0) {
      uVar2 = mpp_writer_bits(s);
      _mpp_log_l(4,"h264e_slice","used bit %2d no_output_of_prior_pics_flag %d\n","write_marking",
                 (ulong)uVar2,(ulong)(uint)marking->no_output_of_prior_pics);
    }
    mpp_writer_put_bits(s,marking->long_term_reference_flag,1);
    if (((byte)h264e_debug & 0x40) == 0) {
      return;
    }
    uVar2 = mpp_writer_bits(s);
    _mpp_log_l(4,"h264e_slice","used bit %2d long_term_reference_flag %d\n","write_marking",
               (ulong)uVar2,(ulong)(uint)marking->long_term_reference_flag);
    return;
  }
  if ((h264e_debug._1_1_ & 4) != 0) {
    _mpp_log_l(4,"h264e_slice","mmco count %d\n","write_marking",(ulong)(uint)marking->wr_cnt);
  }
  marking->rd_cnt = 0;
  if (0 < marking->wr_cnt) {
    mpp_writer_put_bits(s,1,1);
    if (((byte)h264e_debug & 0x40) != 0) {
      uVar2 = mpp_writer_bits(s);
      _mpp_log_l(4,"h264e_slice","used bit %2d adaptive_ref_pic_marking_mode_flag 1\n",
                 "write_marking",(ulong)uVar2);
    }
switchD_0022c234_caseD_5:
    iVar1 = marking->rd_cnt;
    if (marking->wr_cnt <= iVar1) goto LAB_0022c3d5;
    marking->rd_cnt = iVar1 + 1;
    uVar2 = marking->ops[iVar1].mmco;
    val = marking->ops[iVar1].difference_of_pic_nums_minus1;
    val_00 = marking->ops[iVar1].long_term_pic_num;
    val_01 = marking->ops[iVar1].long_term_frame_idx;
    val_02 = marking->ops[iVar1].max_long_term_frame_idx_plus1;
    mpp_writer_put_ue(s,uVar2);
    if (((byte)h264e_debug & 0x40) != 0) {
      uVar3 = mpp_writer_bits(s);
      _mpp_log_l(4,"h264e_slice","used bit %2d memory_management_control_operation %d\n",
                 "write_marking",(ulong)uVar3,(ulong)uVar2);
    }
    switch(uVar2) {
    case 1:
      mpp_writer_put_ue(s,val);
      if (((byte)h264e_debug & 0x40) == 0) goto switchD_0022c234_caseD_5;
      uVar2 = mpp_writer_bits(s);
      pcVar4 = "used bit %2d difference_of_pic_nums_minus1 %d\n";
      uVar5 = (ulong)uVar2;
      uVar6 = (ulong)val;
      break;
    case 2:
      mpp_writer_put_ue(s,val_00);
      if (((byte)h264e_debug & 0x40) == 0) goto switchD_0022c234_caseD_5;
      uVar2 = mpp_writer_bits(s);
      pcVar4 = "used bit %2d long_term_pic_num %d\n";
      uVar5 = (ulong)uVar2;
      uVar6 = (ulong)val_00;
      break;
    case 3:
      mpp_writer_put_ue(s,val);
      if (((byte)h264e_debug & 0x40) != 0) {
        uVar2 = mpp_writer_bits(s);
        _mpp_log_l(4,"h264e_slice","used bit %2d difference_of_pic_nums_minus1 %d\n","write_marking"
                   ,(ulong)uVar2,(ulong)val);
      }
      goto LAB_0022c2d1;
    case 4:
      mpp_writer_put_ue(s,val_02);
      if (((byte)h264e_debug & 0x40) == 0) goto switchD_0022c234_caseD_5;
      uVar2 = mpp_writer_bits(s);
      pcVar4 = "used bit %2d max_long_term_frame_idx_plus1 %d\n";
      uVar5 = (ulong)uVar2;
      uVar6 = (ulong)val_02;
      break;
    case 5:
      goto switchD_0022c234_caseD_5;
    case 6:
LAB_0022c2d1:
      mpp_writer_put_ue(s,val_01);
      if (((byte)h264e_debug & 0x40) == 0) goto switchD_0022c234_caseD_5;
      uVar2 = mpp_writer_bits(s);
      pcVar4 = "used bit %2d long_term_frame_idx %d\n";
      uVar5 = (ulong)uVar2;
      uVar6 = (ulong)val_01;
      break;
    default:
      _mpp_log_l(2,"h264e_slice","invalid mmco %d\n","write_marking",(ulong)uVar2);
      goto switchD_0022c234_caseD_5;
    }
    _mpp_log_l(4,"h264e_slice",pcVar4,"write_marking",uVar5,uVar6);
    goto switchD_0022c234_caseD_5;
  }
  mpp_writer_put_bits(s,0,1);
  if (((byte)h264e_debug & 0x40) == 0) {
    return;
  }
  uVar2 = mpp_writer_bits(s);
  pcVar4 = "used bit %2d adaptive_ref_pic_marking_mode_flag 0\n";
LAB_0022c446:
  _mpp_log_l(4,"h264e_slice",pcVar4,"write_marking",(ulong)uVar2);
  return;
LAB_0022c3d5:
  mpp_writer_put_ue(s,0);
  if (((byte)h264e_debug & 0x40) == 0) {
    return;
  }
  uVar2 = mpp_writer_bits(s);
  pcVar4 = "used bit %2d memory_management_control_operation 0\n";
  goto LAB_0022c446;
}

Assistant:

void write_marking(MppWriteCtx *s, H264eMarkingInfo *marking)
{
    if (marking->idr_flag) {
        /* no_output_of_prior_pics_flag */
        mpp_writer_put_bits(s, marking->no_output_of_prior_pics, 1);
        h264e_dbg_slice("used bit %2d no_output_of_prior_pics_flag %d\n",
                        mpp_writer_bits(s), marking->no_output_of_prior_pics);

        /* long_term_reference_flag */
        mpp_writer_put_bits(s, marking->long_term_reference_flag, 1);
        h264e_dbg_slice("used bit %2d long_term_reference_flag %d\n",
                        mpp_writer_bits(s), marking->long_term_reference_flag);
    } else {
        h264e_dbg_mmco("mmco count %d\n", marking->wr_cnt);

        h264e_marking_rd_rewind(marking);

        if (!h264e_marking_is_empty(marking)) {
            H264eMmco mmco;

            /* adaptive_ref_pic_marking_mode_flag */
            mpp_writer_put_bits(s, 1, 1);
            h264e_dbg_slice("used bit %2d adaptive_ref_pic_marking_mode_flag 1\n",
                            mpp_writer_bits(s));

            while (MPP_OK == h264e_marking_rd_op(marking, &mmco)) {
                /* memory_management_control_operation */
                mpp_writer_put_ue(s, mmco.mmco);
                h264e_dbg_slice("used bit %2d memory_management_control_operation %d\n",
                                mpp_writer_bits(s), mmco.mmco);

                switch (mmco.mmco) {
                case 1 : {
                    /* difference_of_pic_nums_minus1 */
                    mpp_writer_put_ue(s, mmco.difference_of_pic_nums_minus1);
                    h264e_dbg_slice("used bit %2d difference_of_pic_nums_minus1 %d\n",
                                    mpp_writer_bits(s), mmco.difference_of_pic_nums_minus1);
                } break;
                case 2 : {
                    /* long_term_pic_num */
                    mpp_writer_put_ue(s, mmco.long_term_pic_num );
                    h264e_dbg_slice("used bit %2d long_term_pic_num %d\n",
                                    mpp_writer_bits(s), mmco.long_term_pic_num);
                } break;
                case 3 : {
                    /* difference_of_pic_nums_minus1 */
                    mpp_writer_put_ue(s, mmco.difference_of_pic_nums_minus1);
                    h264e_dbg_slice("used bit %2d difference_of_pic_nums_minus1 %d\n",
                                    mpp_writer_bits(s), mmco.difference_of_pic_nums_minus1);

                    /* long_term_frame_idx */
                    mpp_writer_put_ue(s, mmco.long_term_frame_idx );
                    h264e_dbg_slice("used bit %2d long_term_frame_idx %d\n",
                                    mpp_writer_bits(s), mmco.long_term_frame_idx);
                } break;
                case 4 : {
                    /* max_long_term_frame_idx_plus1 */
                    mpp_writer_put_ue(s, mmco.max_long_term_frame_idx_plus1);
                    h264e_dbg_slice("used bit %2d max_long_term_frame_idx_plus1 %d\n",
                                    mpp_writer_bits(s), mmco.max_long_term_frame_idx_plus1);
                } break;
                case 5 : {
                } break;
                case 6 : {
                    /* long_term_frame_idx */
                    mpp_writer_put_ue(s, mmco.long_term_frame_idx);
                    h264e_dbg_slice("used bit %2d long_term_frame_idx %d\n",
                                    mpp_writer_bits(s), mmco.long_term_frame_idx);
                } break;
                default : {
                    mpp_err_f("invalid mmco %d\n", mmco.mmco);
                } break;
                }
            }

            /* memory_management_control_operation */
            mpp_writer_put_ue(s, 0);
            h264e_dbg_slice("used bit %2d memory_management_control_operation 0\n",
                            mpp_writer_bits(s));
        } else {
            /* adaptive_ref_pic_marking_mode_flag */
            mpp_writer_put_bits(s, 0, 1);
            h264e_dbg_slice("used bit %2d adaptive_ref_pic_marking_mode_flag 0\n",
                            mpp_writer_bits(s));
        }
    }
}